

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O2

void __thiscall BS::thread_pool::thread_pool(thread_pool *this,concurrency_t thread_count_)

{
  concurrency_t cVar1;
  
  this->paused = (__atomic_base<bool>)0x0;
  this->running = (__atomic_base<bool>)0x0;
  std::condition_variable::condition_variable(&this->task_available_cv);
  std::condition_variable::condition_variable(&this->task_done_cv);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (&this->tasks);
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->tasks_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->tasks_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->tasks_total).super___atomic_base<unsigned_long>._M_i = 0;
  (this->tasks_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tasks_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  cVar1 = determine_thread_count(this,thread_count_);
  this->thread_count = cVar1;
  determine_thread_count(this,thread_count_);
  std::make_unique<std::thread[]>((size_t)&this->threads);
  (this->waiting)._M_base._M_i = false;
  create_threads(this);
  return;
}

Assistant:

thread_pool(const concurrency_t thread_count_ = 0) : thread_count(determine_thread_count(thread_count_)), threads(std::make_unique<std::thread[]>(determine_thread_count(thread_count_)))
    {
        create_threads();
    }